

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::InitializeFromParent(cmMakefile *this,cmMakefile *parent)

{
  PolicyStatus PVar1;
  char *pcVar2;
  pointer s;
  allocator local_b9;
  string defPropName;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string local_50;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->SystemIncludeDirectories)._M_t,&(parent->SystemIncludeDirectories)._M_t);
  std::__cxx11::string::_M_assign((string *)&this->DefineFlags);
  std::__cxx11::string::_M_assign((string *)&this->DefineFlagsOrig);
  std::__cxx11::string::string
            ((string *)&defPropName,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",(allocator *)&configs);
  std::__cxx11::string::string((string *)&local_98,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",&local_b9);
  pcVar2 = GetProperty(parent,&local_98);
  SetProperty(this,&defPropName,pcVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&defPropName);
  PVar1 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0043);
  if (PVar1 < NEW) {
    std::__cxx11::string::string((string *)&defPropName,"COMPILE_DEFINITIONS",(allocator *)&configs)
    ;
    std::__cxx11::string::string((string *)&local_98,"COMPILE_DEFINITIONS",&local_b9);
    pcVar2 = GetProperty(parent,&local_98);
    SetProperty(this,&defPropName,pcVar2);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&defPropName);
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetConfigurations(&local_50,this,&configs,true);
    std::__cxx11::string::~string((string *)&local_50);
    for (s = configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        s != configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
      std::__cxx11::string::string
                ((string *)&defPropName,"COMPILE_DEFINITIONS_",(allocator *)&local_98);
      cmsys::SystemTools::UpperCase(&local_98,s);
      std::__cxx11::string::append((string *)&defPropName);
      std::__cxx11::string::~string((string *)&local_98);
      pcVar2 = GetProperty(parent,&defPropName);
      SetProperty(this,&defPropName,pcVar2);
      std::__cxx11::string::~string((string *)&defPropName);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configs);
  }
  std::__cxx11::string::string((string *)&defPropName,"LABELS",(allocator *)&configs);
  std::__cxx11::string::string((string *)&local_98,"LABELS",&local_b9);
  pcVar2 = GetProperty(parent,&local_98);
  SetProperty(this,&defPropName,pcVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&defPropName);
  std::__cxx11::string::string((string *)&defPropName,"LINK_LIBRARIES",(allocator *)&configs);
  std::__cxx11::string::string((string *)&local_98,"LINK_LIBRARIES",&local_b9);
  pcVar2 = GetProperty(parent,&local_98);
  SetProperty(this,&defPropName,pcVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&defPropName);
  std::__cxx11::string::string((string *)&defPropName,"LINK_DIRECTORIES",(allocator *)&configs);
  std::__cxx11::string::string((string *)&local_98,"LINK_DIRECTORIES",&local_b9);
  pcVar2 = GetProperty(parent,&local_98);
  SetProperty(this,&defPropName,pcVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&defPropName);
  cmStateSnapshot::GetProjectName_abi_cxx11_(&defPropName,&parent->StateSnapshot);
  cmStateSnapshot::SetProjectName(&this->StateSnapshot,&defPropName);
  std::__cxx11::string::~string((string *)&defPropName);
  std::__cxx11::string::_M_assign((string *)&this->ComplainFileRegularExpression);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->ImportedTargets)._M_h,&(parent->ImportedTargets)._M_h);
  return;
}

Assistant:

void cmMakefile::InitializeFromParent(cmMakefile* parent)
{
  this->SystemIncludeDirectories = parent->SystemIncludeDirectories;

  // define flags
  this->DefineFlags = parent->DefineFlags;
  this->DefineFlagsOrig = parent->DefineFlagsOrig;

  // Include transform property.  There is no per-config version.
  {
    const char* prop = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
    this->SetProperty(prop, parent->GetProperty(prop));
  }

  // compile definitions property and per-config versions
  cmPolicies::PolicyStatus polSt = this->GetPolicyStatus(cmPolicies::CMP0043);
  if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
    this->SetProperty("COMPILE_DEFINITIONS",
                      parent->GetProperty("COMPILE_DEFINITIONS"));
    std::vector<std::string> configs;
    this->GetConfigurations(configs);
    for (std::vector<std::string>::const_iterator ci = configs.begin();
         ci != configs.end(); ++ci) {
      std::string defPropName = "COMPILE_DEFINITIONS_";
      defPropName += cmSystemTools::UpperCase(*ci);
      const char* prop = parent->GetProperty(defPropName);
      this->SetProperty(defPropName, prop);
    }
  }

  // labels
  this->SetProperty("LABELS", parent->GetProperty("LABELS"));

  // link libraries
  this->SetProperty("LINK_LIBRARIES", parent->GetProperty("LINK_LIBRARIES"));

  // link directories
  this->SetProperty("LINK_DIRECTORIES",
                    parent->GetProperty("LINK_DIRECTORIES"));

  // the initial project name
  this->StateSnapshot.SetProjectName(parent->StateSnapshot.GetProjectName());

  // Copy include regular expressions.
  this->ComplainFileRegularExpression = parent->ComplainFileRegularExpression;

  // Imported targets.
  this->ImportedTargets = parent->ImportedTargets;
}